

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O1

int __thiscall KParser::_decassign(KParser *this,int begin,BlockInfo *bi)

{
  int iVar1;
  pointer pTVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  uint uVar5;
  mapped_type *pmVar6;
  size_t sVar7;
  char buf [256];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined1 local_1d8 [32];
  _Alloc_hider local_1b8;
  char local_1a8 [16];
  string local_198;
  string local_178;
  string local_158;
  char local_138 [264];
  
  pTVar2 = (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pTVar2[begin].tokenType == id) && (pTVar2[(long)begin + 1].tokenType == decassign)) {
    local_1d8._0_8_ = local_1d8 + 0x10;
    pcVar3 = (bi->sLabel)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d8,pcVar3,pcVar3 + (bi->sLabel)._M_string_length);
    local_1b8._M_p = local_1a8;
    pcVar3 = (bi->eLabel)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar3,pcVar3 + (bi->eLabel)._M_string_length);
    uVar5 = _expr(this,begin + 2,(BlockInfo *)local_1d8);
    if (local_1b8._M_p != local_1a8) {
      operator_delete(local_1b8._M_p);
    }
    if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
      operator_delete((void *)local_1d8._0_8_);
    }
    if ((int)uVar5 < 0) {
      sprintf(local_138,anon_var_dwarf_16825,
              (ulong)(uint)(this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                           _M_impl.super__Vector_impl_data._M_start[begin + 2].line);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      sVar7 = strlen(local_138);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,local_138,local_138 + sVar7);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_errorMsgs,&local_1f8);
    }
    else {
      pTVar2 = (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pTVar2[uVar5].tokenType == semicolon) {
        this->m_locals = this->m_locals + 1;
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"pop","");
        pTVar2 = (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_start;
        _Var4._M_p = pTVar2[begin].str._M_dataplus._M_p;
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,_Var4._M_p,_Var4._M_p + pTVar2[begin].str._M_string_length);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_198,anon_var_dwarf_16623 + 0x22);
        addCode(this,&local_158,&local_178,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        iVar1 = this->m_increaseLocals;
        this->m_increaseLocals = iVar1 + 1;
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&this->m_varToLocal,
                              &(this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                               _M_impl.super__Vector_impl_data._M_start[begin].str);
        *pmVar6 = iVar1;
        printf("%s => %d\n",
               (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start[begin].str._M_dataplus._M_p,
               (ulong)(uint)this->m_increaseLocals);
        return uVar5 + 1;
      }
      sprintf(local_138,anon_var_dwarf_16831,(ulong)(uint)pTVar2[uVar5].line);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      sVar7 = strlen(local_138);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,local_138,local_138 + sVar7);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_errorMsgs,&local_1f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
  }
  return -1;
}

Assistant:

int KParser::_decassign(int begin,  BlockInfo bi) {
    int i = begin;
    int t;
    int idIndex = i;
    if (m_tokens[i].tokenType != TokenType::id) {
        return -1;
    } 
    i++; 
    if (m_tokens[i].tokenType != TokenType::decassign) {
        return -1;
    } 
    i++; 

    int exprIndex = i;
    t = _expr(i, bi);
    if (t < 0) {
        char buf[256];
        sprintf(buf, "line[%d]: decassign 표현식의 오류\n", m_tokens[i].line); 
        m_errorMsgs.push_back(buf);
        return -1;
    } 
    i = t;

    if (m_tokens[i].tokenType != TokenType::semicolon) {
        char buf[256];
        sprintf(buf, "line[%d]: _decassign ; 가 빠졌습니다.\n", m_tokens[i].line); 
        m_errorMsgs.push_back(buf);
        return -1;
    }
    i++;
    m_locals++;
    addCode("pop", m_tokens[idIndex].str, "");
    m_varToLocal[m_tokens[idIndex].str] = m_increaseLocals++;
    printf("%s => %d\n",  m_tokens[idIndex].str.c_str(), m_increaseLocals);
    return i;
}